

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

xmlCharEncoding xmlParseCharEncoding(char *name)

{
  int iVar1;
  int local_21c;
  char local_218 [4];
  int i;
  char upper [500];
  char *alias;
  char *name_local;
  
  if (name == (char *)0x0) {
    name_local._4_4_ = XML_CHAR_ENCODING_NONE;
  }
  else {
    register0x00000000 = xmlGetEncodingAlias(name);
    alias = name;
    if (register0x00000000 != (char *)0x0) {
      alias = register0x00000000;
    }
    for (local_21c = 0; local_21c < 499; local_21c = local_21c + 1) {
      iVar1 = toupper((int)alias[local_21c]);
      local_218[local_21c] = (char)iVar1;
      if (local_218[local_21c] == '\0') break;
    }
    local_218[local_21c] = '\0';
    iVar1 = strcmp(local_218,"");
    if (iVar1 == 0) {
      name_local._4_4_ = XML_CHAR_ENCODING_NONE;
    }
    else {
      iVar1 = strcmp(local_218,"UTF-8");
      if (iVar1 == 0) {
        name_local._4_4_ = XML_CHAR_ENCODING_UTF8;
      }
      else {
        iVar1 = strcmp(local_218,"UTF8");
        if (iVar1 == 0) {
          name_local._4_4_ = XML_CHAR_ENCODING_UTF8;
        }
        else {
          iVar1 = strcmp(local_218,"UTF-16");
          if (iVar1 == 0) {
            name_local._4_4_ = XML_CHAR_ENCODING_UTF16LE;
          }
          else {
            iVar1 = strcmp(local_218,"UTF16");
            if (iVar1 == 0) {
              name_local._4_4_ = XML_CHAR_ENCODING_UTF16LE;
            }
            else {
              iVar1 = strcmp(local_218,"ISO-10646-UCS-2");
              if (iVar1 == 0) {
                name_local._4_4_ = XML_CHAR_ENCODING_UCS2;
              }
              else {
                iVar1 = strcmp(local_218,"UCS-2");
                if (iVar1 == 0) {
                  name_local._4_4_ = XML_CHAR_ENCODING_UCS2;
                }
                else {
                  iVar1 = strcmp(local_218,"UCS2");
                  if (iVar1 == 0) {
                    name_local._4_4_ = XML_CHAR_ENCODING_UCS2;
                  }
                  else {
                    iVar1 = strcmp(local_218,"ISO-10646-UCS-4");
                    if (iVar1 == 0) {
                      name_local._4_4_ = XML_CHAR_ENCODING_UCS4LE;
                    }
                    else {
                      iVar1 = strcmp(local_218,"UCS-4");
                      if (iVar1 == 0) {
                        name_local._4_4_ = XML_CHAR_ENCODING_UCS4LE;
                      }
                      else {
                        iVar1 = strcmp(local_218,"UCS4");
                        if (iVar1 == 0) {
                          name_local._4_4_ = XML_CHAR_ENCODING_UCS4LE;
                        }
                        else {
                          iVar1 = strcmp(local_218,"ISO-8859-1");
                          if (iVar1 == 0) {
                            name_local._4_4_ = XML_CHAR_ENCODING_8859_1;
                          }
                          else {
                            iVar1 = strcmp(local_218,"ISO-LATIN-1");
                            if (iVar1 == 0) {
                              name_local._4_4_ = XML_CHAR_ENCODING_8859_1;
                            }
                            else {
                              iVar1 = strcmp(local_218,"ISO LATIN 1");
                              if (iVar1 == 0) {
                                name_local._4_4_ = XML_CHAR_ENCODING_8859_1;
                              }
                              else {
                                iVar1 = strcmp(local_218,"ISO-8859-2");
                                if (iVar1 == 0) {
                                  name_local._4_4_ = XML_CHAR_ENCODING_8859_2;
                                }
                                else {
                                  iVar1 = strcmp(local_218,"ISO-LATIN-2");
                                  if (iVar1 == 0) {
                                    name_local._4_4_ = XML_CHAR_ENCODING_8859_2;
                                  }
                                  else {
                                    iVar1 = strcmp(local_218,"ISO LATIN 2");
                                    if (iVar1 == 0) {
                                      name_local._4_4_ = XML_CHAR_ENCODING_8859_2;
                                    }
                                    else {
                                      iVar1 = strcmp(local_218,"ISO-8859-3");
                                      if (iVar1 == 0) {
                                        name_local._4_4_ = XML_CHAR_ENCODING_8859_3;
                                      }
                                      else {
                                        iVar1 = strcmp(local_218,"ISO-8859-4");
                                        if (iVar1 == 0) {
                                          name_local._4_4_ = XML_CHAR_ENCODING_8859_4;
                                        }
                                        else {
                                          iVar1 = strcmp(local_218,"ISO-8859-5");
                                          if (iVar1 == 0) {
                                            name_local._4_4_ = XML_CHAR_ENCODING_8859_5;
                                          }
                                          else {
                                            iVar1 = strcmp(local_218,"ISO-8859-6");
                                            if (iVar1 == 0) {
                                              name_local._4_4_ = XML_CHAR_ENCODING_8859_6;
                                            }
                                            else {
                                              iVar1 = strcmp(local_218,"ISO-8859-7");
                                              if (iVar1 == 0) {
                                                name_local._4_4_ = XML_CHAR_ENCODING_8859_7;
                                              }
                                              else {
                                                iVar1 = strcmp(local_218,"ISO-8859-8");
                                                if (iVar1 == 0) {
                                                  name_local._4_4_ = XML_CHAR_ENCODING_8859_8;
                                                }
                                                else {
                                                  iVar1 = strcmp(local_218,"ISO-8859-9");
                                                  if (iVar1 == 0) {
                                                    name_local._4_4_ = XML_CHAR_ENCODING_8859_9;
                                                  }
                                                  else {
                                                    iVar1 = strcmp(local_218,"ISO-2022-JP");
                                                    if (iVar1 == 0) {
                                                      name_local._4_4_ = XML_CHAR_ENCODING_2022_JP;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(local_218,"SHIFT_JIS");
                                                      if (iVar1 == 0) {
                                                        name_local._4_4_ =
                                                             XML_CHAR_ENCODING_SHIFT_JIS;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(local_218,"EUC-JP");
                                                        if (iVar1 == 0) {
                                                          name_local._4_4_ =
                                                               XML_CHAR_ENCODING_EUC_JP;
                                                        }
                                                        else {
                                                          name_local._4_4_ = XML_CHAR_ENCODING_ERROR
                                                          ;
                                                        }
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return name_local._4_4_;
}

Assistant:

xmlCharEncoding
xmlParseCharEncoding(const char* name)
{
    const char *alias;
    char upper[500];
    int i;

    if (name == NULL)
	return(XML_CHAR_ENCODING_NONE);

    /*
     * Do the alias resolution
     */
    alias = xmlGetEncodingAlias(name);
    if (alias != NULL)
	name = alias;

    for (i = 0;i < 499;i++) {
        upper[i] = toupper(name[i]);
	if (upper[i] == 0) break;
    }
    upper[i] = 0;

    if (!strcmp(upper, "")) return(XML_CHAR_ENCODING_NONE);
    if (!strcmp(upper, "UTF-8")) return(XML_CHAR_ENCODING_UTF8);
    if (!strcmp(upper, "UTF8")) return(XML_CHAR_ENCODING_UTF8);

    /*
     * NOTE: if we were able to parse this, the endianness of UTF16 is
     *       already found and in use
     */
    if (!strcmp(upper, "UTF-16")) return(XML_CHAR_ENCODING_UTF16LE);
    if (!strcmp(upper, "UTF16")) return(XML_CHAR_ENCODING_UTF16LE);

    if (!strcmp(upper, "ISO-10646-UCS-2")) return(XML_CHAR_ENCODING_UCS2);
    if (!strcmp(upper, "UCS-2")) return(XML_CHAR_ENCODING_UCS2);
    if (!strcmp(upper, "UCS2")) return(XML_CHAR_ENCODING_UCS2);

    /*
     * NOTE: if we were able to parse this, the endianness of UCS4 is
     *       already found and in use
     */
    if (!strcmp(upper, "ISO-10646-UCS-4")) return(XML_CHAR_ENCODING_UCS4LE);
    if (!strcmp(upper, "UCS-4")) return(XML_CHAR_ENCODING_UCS4LE);
    if (!strcmp(upper, "UCS4")) return(XML_CHAR_ENCODING_UCS4LE);


    if (!strcmp(upper,  "ISO-8859-1")) return(XML_CHAR_ENCODING_8859_1);
    if (!strcmp(upper,  "ISO-LATIN-1")) return(XML_CHAR_ENCODING_8859_1);
    if (!strcmp(upper,  "ISO LATIN 1")) return(XML_CHAR_ENCODING_8859_1);

    if (!strcmp(upper,  "ISO-8859-2")) return(XML_CHAR_ENCODING_8859_2);
    if (!strcmp(upper,  "ISO-LATIN-2")) return(XML_CHAR_ENCODING_8859_2);
    if (!strcmp(upper,  "ISO LATIN 2")) return(XML_CHAR_ENCODING_8859_2);

    if (!strcmp(upper,  "ISO-8859-3")) return(XML_CHAR_ENCODING_8859_3);
    if (!strcmp(upper,  "ISO-8859-4")) return(XML_CHAR_ENCODING_8859_4);
    if (!strcmp(upper,  "ISO-8859-5")) return(XML_CHAR_ENCODING_8859_5);
    if (!strcmp(upper,  "ISO-8859-6")) return(XML_CHAR_ENCODING_8859_6);
    if (!strcmp(upper,  "ISO-8859-7")) return(XML_CHAR_ENCODING_8859_7);
    if (!strcmp(upper,  "ISO-8859-8")) return(XML_CHAR_ENCODING_8859_8);
    if (!strcmp(upper,  "ISO-8859-9")) return(XML_CHAR_ENCODING_8859_9);

    if (!strcmp(upper, "ISO-2022-JP")) return(XML_CHAR_ENCODING_2022_JP);
    if (!strcmp(upper, "SHIFT_JIS")) return(XML_CHAR_ENCODING_SHIFT_JIS);
    if (!strcmp(upper, "EUC-JP")) return(XML_CHAR_ENCODING_EUC_JP);

#ifdef DEBUG_ENCODING
    xmlGenericError(xmlGenericErrorContext, "Unknown encoding %s\n", name);
#endif
    return(XML_CHAR_ENCODING_ERROR);
}